

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  StringRef *pSVar1;
  char cVar2;
  Style SVar3;
  ulong uVar4;
  size_type sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  StringRef Chars;
  
  uVar4 = (this->Path).Length;
  if (uVar4 <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x102,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  pSVar1 = &this->Component;
  uVar8 = (this->Component).Length;
  uVar7 = this->Position + uVar8;
  this->Position = uVar7;
  if (uVar7 == uVar4) {
    pSVar1->Data = (char *)0x0;
    (this->Component).Length = 0;
    return this;
  }
  if (2 < uVar8) {
    pcVar9 = (this->Component).Data;
    cVar2 = *pcVar9;
    if ((((cVar2 == '/') || (cVar2 == '\\' && this->S == windows)) && (pcVar9[1] == cVar2)) &&
       (pcVar9[2] != '/')) {
      bVar10 = pcVar9[2] != '\\' || this->S != windows;
      goto LAB_00194daa;
    }
  }
  bVar10 = false;
LAB_00194daa:
  if (uVar4 <= uVar7) {
LAB_00194f12:
    __assert_fail("Index < Length && \"Invalid index!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0xef,"char llvm::StringRef::operator[](size_t) const");
  }
  pcVar9 = (this->Path).Data;
  SVar3 = this->S;
  if ((pcVar9[uVar7] == '/') || (pcVar9[uVar7] == '\\' && SVar3 == windows)) {
    if ((bVar10) || ((uVar8 != 0 && SVar3 == windows && (pSVar1->Data[uVar8 - 1] == ':')))) {
      uVar8 = uVar7;
      if (uVar4 < uVar7) {
        uVar8 = uVar4;
      }
      sVar6 = 1;
      if (uVar4 <= uVar7) {
        sVar6 = uVar4 - uVar8;
      }
      (this->Component).Data = pcVar9 + uVar8;
      (this->Component).Length = sVar6;
      return this;
    }
    uVar8 = this->Position;
    uVar7 = uVar8;
    while (uVar8 != uVar4) {
      if (uVar4 <= uVar8) goto LAB_00194f12;
      if ((pcVar9[uVar8] != '/') && (SVar3 != windows || pcVar9[uVar8] != '\\')) {
        uVar7 = uVar8;
        if (uVar8 != uVar4) goto LAB_00194e9b;
        break;
      }
      uVar8 = uVar8 + 1;
      this->Position = uVar8;
      uVar7 = uVar4;
    }
    if (((this->Component).Length != 1) || (*pSVar1->Data != '/')) {
      this->Position = uVar7 - 1;
      (this->Component).Data = ".";
      (this->Component).Length = 1;
      return this;
    }
  }
LAB_00194e9b:
  pcVar9 = "/";
  if (SVar3 == windows) {
    pcVar9 = "\\/";
  }
  Chars.Length = (ulong)(SVar3 == windows) + 1;
  Chars.Data = pcVar9;
  sVar5 = StringRef::find_first_of(&this->Path,Chars,this->Position);
  uVar4 = (this->Path).Length;
  uVar8 = this->Position;
  if (uVar4 < this->Position) {
    uVar8 = uVar4;
  }
  uVar7 = sVar5;
  if (sVar5 < uVar8) {
    uVar7 = uVar8;
  }
  if (uVar4 < sVar5) {
    uVar7 = uVar4;
  }
  (this->Component).Data = (this->Path).Data + uVar8;
  (this->Component).Length = uVar7 - uVar8;
  return this;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }